

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_cmn.cpp
# Opt level: O0

UBool ucln_lib_cleanup_63(void)

{
  int local_10;
  ECleanupLibraryType local_c;
  int32_t commonFunc;
  int32_t libType;
  
  for (local_c = UCLN_UPLUG; local_c < UCLN_COMMON; local_c = local_c + UCLN_CUSTOM) {
    ucln_cleanupOne_63(local_c);
  }
  for (local_10 = 0; local_10 < 0x17; local_10 = local_10 + 1) {
    if (gCommonCleanupFunctions[local_10] != (cleanupFunc *)0x0) {
      (*gCommonCleanupFunctions[local_10])();
      gCommonCleanupFunctions[local_10] = (cleanupFunc *)0x0;
    }
  }
  return '\x01';
}

Assistant:

U_CFUNC UBool ucln_lib_cleanup(void) {
    int32_t libType = UCLN_START;
    int32_t commonFunc = UCLN_COMMON_START;

    for (libType++; libType<UCLN_COMMON; libType++) {
        ucln_cleanupOne(static_cast<ECleanupLibraryType>(libType));
    }

    for (commonFunc++; commonFunc<UCLN_COMMON_COUNT; commonFunc++) {
        if (gCommonCleanupFunctions[commonFunc])
        {
            gCommonCleanupFunctions[commonFunc]();
            gCommonCleanupFunctions[commonFunc] = NULL;
        }
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_unRegisterAutomaticCleanup();
#endif
    return TRUE;
}